

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<bool,_std::allocator<bool>_> *variable,string *value)

{
  bool bVar1;
  
  bVar1 = std::operator==(value,"1");
  if (!bVar1) {
    bVar1 = std::operator==(value,"ON");
    if (!bVar1) {
      bVar1 = std::operator==(value,"on");
      if (!bVar1) {
        bVar1 = std::operator==(value,"On");
        if (!bVar1) {
          bVar1 = std::operator==(value,"TRUE");
          if (!bVar1) {
            bVar1 = std::operator==(value,"true");
            if (!bVar1) {
              bVar1 = std::operator==(value,"True");
              if (!bVar1) {
                bVar1 = std::operator==(value,"yes");
                if (!bVar1) {
                  bVar1 = std::operator==(value,"Yes");
                  if (!bVar1) {
                    bVar1 = std::operator==(value,"YES");
                    if (!bVar1) {
                      bVar1 = false;
                      goto LAB_0047d04a;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = true;
LAB_0047d04a:
  std::vector<bool,_std::allocator<bool>_>::push_back(variable,bVar1);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<bool>* variable,
                                            const std::string& value)
{
  bool val = false;
  if (value == "1" || value == "ON" || value == "on" || value == "On" ||
      value == "TRUE" || value == "true" || value == "True" ||
      value == "yes" || value == "Yes" || value == "YES") {
    val = true;
  }
  variable->push_back(val);
}